

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

char * __thiscall
cppcms::impl::url_rewriter::rule::rewrite_once(rule *this,cmatch *m,string_pool *pool)

{
  int iVar1;
  pointer piVar2;
  pointer ppVar3;
  pointer pbVar4;
  size_t sVar5;
  bool bVar6;
  long lVar7;
  ptrdiff_t _Num_1;
  char *pcVar8;
  size_t __n;
  char *__src;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  ptrdiff_t _Num;
  long lVar12;
  ulong uVar13;
  difference_type __d;
  char *pcVar14;
  
  sVar11 = this->pattern_size;
  piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 2;
    ppVar3 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      iVar1 = piVar2[lVar9];
      lVar12 = (long)iVar1;
      pcVar10 = (char *)0x0;
      bVar6 = false;
      if (lVar12 < 0) {
LAB_0023ca6b:
        pcVar10 = (char *)0x0;
        bVar6 = false;
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = (char *)0x0;
        if (iVar1 < (int)((ulong)((long)(m->offsets_).
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3)
                         >> 3)) {
          if ((long)ppVar3[lVar12].first == -1) goto LAB_0023ca6b;
          pcVar14 = m->begin_ + ppVar3[lVar12].first;
          pcVar10 = m->begin_ + ppVar3[lVar12].second;
          bVar6 = true;
        }
      }
      lVar12 = (long)pcVar10 - (long)pcVar14;
      if (!bVar6) {
        lVar12 = 0;
      }
      sVar11 = sVar11 + lVar12;
      lVar9 = lVar9 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar9);
  }
  pcVar14 = string_pool::allocate_space(pool,sVar11 + 1);
  memset(pcVar14,0,sVar11 + 1);
  pcVar10 = pcVar14;
  if ((this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar7 = 8;
    uVar13 = 0;
    do {
      pbVar4 = (this->pattern).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = *(size_t *)((long)&(pbVar4->_M_dataplus)._M_p + lVar7);
      if (sVar5 != 0) {
        memmove(pcVar10,*(void **)((long)pbVar4 + lVar7 + -8),sVar5);
      }
      iVar1 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13];
      lVar9 = (long)iVar1;
      if (((lVar9 < 0) ||
          (ppVar3 = (m->offsets_).
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (int)((ulong)((long)(m->offsets_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3) <=
          iVar1)) || (lVar12 = (long)ppVar3[lVar9].first, lVar12 == -1)) {
        __src = (char *)0x0;
      }
      else {
        __src = m->begin_ + lVar12;
      }
      if (((iVar1 < 0) ||
          (ppVar3 = (m->offsets_).
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (int)((ulong)((long)(m->offsets_).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar3) >> 3) <=
          iVar1)) || (ppVar3[lVar9].first == -1)) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8 = m->begin_ + ppVar3[lVar9].second;
      }
      __n = (long)pcVar8 - (long)__src;
      if (__n != 0) {
        memmove(pcVar10 + sVar5,__src,__n);
      }
      pcVar10 = pcVar10 + sVar5 + __n;
      uVar13 = uVar13 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar13 < (ulong)((long)(this->index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  pbVar4 = (this->pattern).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar5 = pbVar4[-1]._M_string_length;
  if (sVar5 != 0) {
    memmove(pcVar10,pbVar4[-1]._M_dataplus._M_p,sVar5);
  }
  pcVar10[sVar5] = '\0';
  return pcVar14;
}

Assistant:

char *rewrite_once(booster::cmatch const &m,string_pool &pool) const
		{
			size_t total_size = pattern_size;
			for(size_t i=0;i<index.size();i++) {
				total_size += m[index[i]].length();
			}
			char *new_url = pool.alloc(total_size+1);
			char *ptr = new_url;
			for(size_t i=0;i<index.size();i++) {
				ptr = std::copy(pattern[i].begin(),pattern[i].end(),ptr);
				ptr = std::copy(m[index[i]].first,m[index[i]].second,ptr);
			}
			ptr = std::copy(pattern.back().begin(),pattern.back().end(),ptr);
			*ptr = 0;
			return new_url;
		}